

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

void __thiscall pbrt::BDPTIntegrator::Render(BDPTIntegrator *this)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  ushort uVar2;
  RGBColorSpace *colorSpace;
  BDPTIntegrator *pBVar3;
  int iVar4;
  Allocator AVar5;
  PixelSensor *pPVar6;
  RGBFilm *this_00;
  pointer pFVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  pointer pFVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int t;
  string filename;
  ImageMetadata metadata;
  int local_2f0;
  float local_2ec;
  int local_2e8;
  int local_2e4;
  string local_2e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  BDPTIntegrator *local_298;
  vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *local_290;
  ImageMetadata local_288;
  undefined1 local_188 [48];
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  Tuple2<pbrt::Point2,_int> local_130;
  Tuple2<pbrt::Point2,_int> TStack_128;
  Tuple2<pbrt::Point2,_int> local_120;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  TStack_118;
  float local_110;
  undefined4 uStack_10c;
  PixelSensor *pPStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  undefined1 local_e8;
  undefined1 local_a4;
  undefined1 local_90;
  undefined1 local_84;
  undefined1 local_7c;
  undefined1 local_74;
  undefined1 local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_60;
  
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    local_290 = &this->weightFilms;
    std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::resize
              (local_290,(long)(((this->maxDepth + 6) * (this->maxDepth + 1)) / 2));
    local_2e8 = 0;
    iVar9 = this->maxDepth;
    pBVar3 = this;
    if (-1 < iVar9) {
      do {
        local_298 = pBVar3;
        local_2f0 = 0;
        iVar4 = local_2e8;
        if (-3 < local_2e8) {
          iVar9 = local_2e8 + 2;
          do {
            local_2e4 = iVar9 - local_2f0;
            iVar8 = iVar9;
            if ((local_2e4 != 0) && (iVar8 = 1, local_2e4 != 1 || local_2f0 != 1)) {
              local_2e0._M_string_length = 0;
              local_2e0.field_2._M_local_buf[0] = '\0';
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              detail::stringPrintfRecursive<int&,int&,int&>
                        (&local_2e0,"bdpt_d%02i_s%02i_t%02i.exr",&local_2e8,&local_2f0,&local_2e4);
              uVar13 = (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits & 0xffffffffffff;
              TVar1 = *(Tuple2<pbrt::Point2,_int> *)(*(ulong *)(uVar13 + 0x340) & 0xffffffffffff);
              uVar12 = TVar1.x;
              uVar11 = 0;
              if (0 < (int)uVar12) {
                uVar11 = (ulong)TVar1 & 0xffffffff;
              }
              uVar16 = TVar1.y;
              uVar15 = 0;
              if (uVar16 != 0 && -1 < (long)TVar1) {
                uVar15 = (ulong)uVar16;
              }
              local_2c0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)operator_new(8);
              *(undefined8 *)local_2c0 = 0x3f0000003f000000;
              local_2ec = *(float *)((*(ulong *)(uVar13 + 0x340) & 0xffffffffffff) + 0x20) * 1000.0;
              AVar5.memoryResource = pstd::pmr::new_delete_resource();
              pPVar6 = PixelSensor::CreateDefault(AVar5);
              local_2b8 = local_2a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,local_2e0._M_dataplus._M_p,
                         local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
              TStack_128.x = (int)uVar12 >> 0x1f & uVar12;
              local_120 = (Tuple2<pbrt::Point2,_int>)(uVar11 | uVar15 << 0x20);
              TStack_128.y = (int)uVar16 >> 0x1f & uVar16;
              TStack_118.bits = (ulong)local_2c0 | 0x1000000000000;
              local_110 = local_2ec;
              local_130 = TVar1;
              pPStack_108 = pPVar6;
              local_100 = &local_f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,local_2b8,local_2b0 + (long)local_2b8);
              this = local_298;
              if (local_2b8 != local_2a8) {
                operator_delete(local_2b8,local_2a8[0] + 1);
              }
              this_00 = (RGBFilm *)operator_new(0xa8);
              local_158._M_p = (pointer)&local_148;
              local_188._16_4_ = local_120.x;
              local_188._20_4_ = local_120.y;
              local_188._24_8_ = TStack_118.bits;
              local_188._36_4_ = uStack_10c;
              local_188._32_4_ = local_110;
              local_188._0_4_ = local_130.x;
              local_188._4_4_ = local_130.y;
              local_188._8_4_ = TStack_128.x;
              local_188._12_4_ = TStack_128.y;
              local_188._40_8_ = pPStack_108;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,local_100,local_f8 + (long)local_100);
              colorSpace = RGBColorSpace::sRGB;
              AVar5.memoryResource = pstd::pmr::new_delete_resource();
              RGBFilm::RGBFilm(this_00,(FilmBaseParameters *)local_188,colorSpace,INFINITY,true,
                               AVar5);
              (local_290->super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>).
              _M_impl.super__Vector_impl_data._M_start
              [((local_2e4 + 3 + local_2f0) * (local_2e4 + -2 + local_2f0)) / 2 + local_2f0].
              super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
                   (ulong)this_00 | 0x1000000000000;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_p != &local_148) {
                operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
              }
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              iVar4 = local_2e8;
              iVar8 = local_2f0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                         local_2e0.field_2._M_local_buf[0]) + 1);
                iVar4 = local_2e8;
                iVar8 = local_2f0;
              }
            }
            local_2f0 = iVar8 + 1;
            iVar9 = iVar4 + 2;
          } while (iVar8 < iVar9);
          iVar9 = this->maxDepth;
        }
        local_2e8 = iVar4 + 1;
        pBVar3 = local_298;
      } while (iVar4 < iVar9);
    }
  }
  ImageTileIntegrator::Render((ImageTileIntegrator *)this);
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    uVar11 = (this->super_RayIntegrator).super_ImageTileIntegrator.samplerPrototype.
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             .bits;
    uVar2 = (ushort)(uVar11 >> 0x30);
    if (uVar11 >> 0x30 < 5) {
      if (uVar2 < 3) {
        piVar10 = (int *)((uVar11 & 0xffffffffffff) + (ulong)(uVar2 != 2) * 8);
      }
      else {
        piVar10 = (int *)((ulong)((uVar2 & 6) == 2) * 0x10 + (uVar11 & 0xffffffffffff));
      }
      iVar9 = *piVar10;
    }
    else {
      piVar10 = (int *)(uVar11 & 0xffffffffffff);
      if (uVar2 - 4 < 3) {
        iVar9 = *piVar10;
        if (uVar2 - 4 == 2) {
          iVar9 = iVar9 * piVar10[1];
        }
      }
      else {
        iVar9 = *piVar10;
      }
    }
    pFVar14 = (this->weightFilms).
              super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar7 = (this->weightFilms).
             super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar7 != pFVar14) {
      lVar17 = 0;
      uVar11 = 0;
      local_2c0 = &local_288.stringVectors;
      local_2ec = 1.0 / (float)iVar9;
      do {
        _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_60._M_impl.super__Rb_tree_header._M_header;
        local_130.y._0_1_ = 0;
        local_e8 = 0;
        local_a4 = 0;
        local_90 = 0;
        local_84 = 0;
        local_7c = 0;
        local_74 = 0;
        local_68 = 0;
        _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((*(ulong *)((long)&(pFVar14->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits
                       + lVar17) & 0xffffffffffff) != 0) {
          local_288.renderTimeSeconds.set = false;
          local_288.cameraFromWorld.set = false;
          local_288.NDCFromWorld.set = false;
          local_288.pixelBounds.set = false;
          local_288.fullResolution.set = false;
          local_288.samplesPerPixel.set = false;
          local_288.MSE.set = false;
          local_288.colorSpace.set = false;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::_Rb_tree(&local_2c0->_M_t,&_Stack_60);
          FilmHandle::WriteImage
                    ((FilmHandle *)
                     ((long)&(pFVar14->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits +
                     lVar17),&local_288,local_2ec);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_2c0->_M_t);
          if (local_288.colorSpace.set == true) {
            local_288.colorSpace.set = false;
          }
          if (local_288.MSE.set == true) {
            local_288.MSE.set = false;
          }
          if (local_288.samplesPerPixel.set == true) {
            local_288.samplesPerPixel.set = false;
          }
          if (local_288.fullResolution.set == true) {
            local_288.fullResolution.set = false;
          }
          if (local_288.pixelBounds.set == true) {
            local_288.pixelBounds.set = false;
          }
          if (local_288.NDCFromWorld.set == true) {
            local_288.NDCFromWorld.set = false;
          }
          if (local_288.cameraFromWorld.set == true) {
            local_288.cameraFromWorld.set = false;
          }
          if (local_288.renderTimeSeconds.set == true) {
            local_288.renderTimeSeconds.set = false;
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_60);
        pFVar7 = (this->weightFilms).
                 super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pFVar14 = (this->weightFilms).
                  super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = uVar11 + 1;
        lVar17 = lVar17 + 8;
      } while (uVar11 < (ulong)((long)pFVar7 - (long)pFVar14 >> 3));
    }
    if (pFVar7 != pFVar14) {
      (this->weightFilms).super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish = pFVar14;
    }
  }
  return;
}

Assistant:

void BDPTIntegrator::Render() {
    // Allocate buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const int bufferCount = (1 + maxDepth) * (6 + maxDepth) / 2;
        weightFilms.resize(bufferCount);
        for (int depth = 0; depth <= maxDepth; ++depth) {
            for (int s = 0; s <= depth + 2; ++s) {
                int t = depth + 2 - s;
                if (t == 0 || (s == 1 && t == 1))
                    continue;

                std::string filename =
                    StringPrintf("bdpt_d%02i_s%02i_t%02i.exr", depth, s, t);

                FilmBaseParameters p(
                    camera.GetFilm().FullResolution(),
                    Bounds2i(Point2i(0, 0), camera.GetFilm().FullResolution()),
                    new BoxFilter,  // FIXME: leaks
                    camera.GetFilm().Diagonal() * 1000, PixelSensor::CreateDefault(),
                    filename);
                weightFilms[BufferIndex(s, t)] = new RGBFilm(p, RGBColorSpace::sRGB);
            }
        }
    }

    RayIntegrator::Render();

    // Write buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const Float invSampleCount = 1.0f / samplerPrototype.SamplesPerPixel();
        for (size_t i = 0; i < weightFilms.size(); ++i) {
            ImageMetadata metadata;
            if (weightFilms[i])
                weightFilms[i].WriteImage(metadata, invSampleCount);
        }
        weightFilms.clear();
    }
}